

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void av1_init_motion_fpf(search_site_config *cfg,int stride)

{
  FULLPEL_MV FVar1;
  search_site (*pasVar2) [17];
  int radius;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  FULLPEL_MV local_58;
  short local_54;
  undefined2 uStack_52;
  short local_50;
  undefined4 local_4e;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  FULLPEL_MV search_site_mvs [13];
  
  pasVar2 = cfg->site + 10;
  cfg->site[10][0].mv.row = 0;
  cfg->site[10][0].mv.col = 0;
  cfg->site[10][0].offset = 0;
  cfg->stride = stride;
  uVar3 = 0x400;
  lVar5 = 10;
  iVar6 = 0;
  do {
    iVar4 = (int)((double)uVar3 * 0.41);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    local_58.row = 0;
    local_58.col = 0;
    local_50 = (short)uVar3;
    local_54 = -local_50;
    uStack_52 = 0;
    local_4e = 0;
    local_4a = local_54;
    local_48 = 0;
    local_46 = local_50;
    local_44 = local_54;
    local_3e = (short)iVar4;
    local_42 = -local_3e;
    local_40 = local_50;
    local_3c = local_42;
    local_3a = local_50;
    search_site_mvs[0].row = local_3e;
    search_site_mvs[0].col = local_54;
    search_site_mvs[1].row = local_54;
    search_site_mvs[1].col = local_3e;
    search_site_mvs[2].row = local_50;
    search_site_mvs[2].col = local_42;
    search_site_mvs[3].row = local_3e;
    search_site_mvs[3].col = local_50;
    search_site_mvs[4].row = local_42;
    search_site_mvs[4].col = local_54;
    uVar7 = 0;
    do {
      FVar1 = (&local_58)[uVar7];
      (*pasVar2)[uVar7].mv = FVar1;
      (*pasVar2)[uVar7].offset = (int)(*pasVar2)[uVar7].mv.col + FVar1.row * stride;
      uVar7 = uVar7 + 1;
    } while ((uint)(uVar3 != 1) * 4 + 9 != uVar7);
    cfg->searches_per_step[lVar5] = (uint)(uVar3 != 1) * 4 + 8;
    cfg->radius[lVar5] = uVar3;
    lVar5 = lVar5 + -1;
    iVar6 = iVar6 + 1;
    uVar3 = uVar3 >> 1;
    pasVar2 = pasVar2 + -1;
  } while (iVar6 != 0xb);
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

void av1_init_motion_fpf(search_site_config *cfg, int stride) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  for (int radius = MAX_FIRST_STEP; radius > 0; radius /= 2) {
    // Generate offsets for 8 search sites per step.
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if (radius == 1) num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}